

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

string * __thiscall
cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem
          (string *__return_storage_ptr__,FeatureDescriptor *this,string *library,ItemIsPath isPath)

{
  string *psVar1;
  string format;
  FeaturePlaceHolderExpander expander;
  string sStack_58;
  cmPlaceholderExpander local_38;
  string *local_30;
  string *local_28;
  string *local_20;
  
  std::__cxx11::string::string
            ((string *)&sStack_58,(string *)(&this->ItemPathFormat + (isPath != Yes)));
  local_38._vptr_cmPlaceholderExpander = (_func_int **)&PTR__cmPlaceholderExpander_007d4db8;
  local_30 = library;
  local_28 = library;
  local_20 = library;
  psVar1 = cmPlaceholderExpander::ExpandVariables(&local_38,&sStack_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem(
  std::string const& library, ItemIsPath isPath) const
{
  auto format =
    isPath == ItemIsPath::Yes ? this->ItemPathFormat : this->ItemNameFormat;

  // replace <LIBRARY>, <LIB_ITEM> and <LINK_ITEM> patterns with library path
  FeaturePlaceHolderExpander expander(&library, &library, &library);
  return expander.ExpandVariables(format);
}